

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_prediction_scheme_parallelogram_shared.h
# Opt level: O2

void draco::GetParallelogramEntries<draco::CornerTable>
               (CornerIndex ci,CornerTable *table,
               vector<int,_std::allocator<int>_> *vertex_to_data_map,int *opp_entry,int *next_entry,
               int *prev_entry)

{
  int iVar1;
  pointer pIVar2;
  ulong uVar3;
  pointer piVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = 0xffffffff;
  if (ci.value_ == 0xffffffff) {
    piVar4 = (vertex_to_data_map->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar1 = piVar4[0xffffffff];
    *opp_entry = iVar1;
    *next_entry = iVar1;
  }
  else {
    pIVar2 = (table->corner_to_vertex_map_).vector_.
             super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    piVar4 = (vertex_to_data_map->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    *opp_entry = piVar4[pIVar2[ci.value_].value_];
    uVar5 = ci.value_ - 2;
    if ((ci.value_ + 1) % 3 != 0) {
      uVar5 = ci.value_ + 1;
    }
    uVar3 = 0xffffffff;
    if (uVar5 != 0xffffffff) {
      uVar3 = (ulong)pIVar2[uVar5].value_;
    }
    *next_entry = piVar4[uVar3];
    if (ci.value_ % 3 == 0) {
      uVar5 = ci.value_ + 2;
      if (uVar5 == 0xffffffff) goto LAB_0015535c;
    }
    else {
      uVar5 = ci.value_ - 1;
    }
    uVar6 = (ulong)pIVar2[uVar5].value_;
  }
LAB_0015535c:
  *prev_entry = piVar4[uVar6];
  return;
}

Assistant:

inline void GetParallelogramEntries(
    const CornerIndex ci, const CornerTableT *table,
    const std::vector<int32_t> &vertex_to_data_map, int *opp_entry,
    int *next_entry, int *prev_entry) {
  // One vertex of the input |table| correspond to exactly one attribute value
  // entry. The |table| can be either CornerTable for per-vertex attributes,
  // or MeshAttributeCornerTable for attributes with interior seams.
  *opp_entry = vertex_to_data_map[table->Vertex(ci).value()];
  *next_entry = vertex_to_data_map[table->Vertex(table->Next(ci)).value()];
  *prev_entry = vertex_to_data_map[table->Vertex(table->Previous(ci)).value()];
}